

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::QuoteMetaHasNull(void)

{
  allocator local_101;
  Options local_100;
  string has_null;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  has_null._M_dataplus._M_p = (pointer)&has_null.field_2;
  has_null._M_string_length = 0;
  has_null.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)&has_null);
  std::__cxx11::string::string((string *)&local_28,(string *)&has_null);
  RE2::Options::Options(&local_100,DefaultOptions);
  TestQuoteMeta(&local_28,&local_100);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_48,(string *)&has_null);
  std::__cxx11::string::string((string *)&local_68,"",&local_101);
  RE2::Options::Options(&local_100,DefaultOptions);
  NegativeTestQuoteMeta(&local_48,&local_68,&local_100);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::push_back((char)&has_null);
  std::__cxx11::string::string((string *)&local_88,(string *)&has_null);
  RE2::Options::Options(&local_100,DefaultOptions);
  TestQuoteMeta(&local_88,&local_100);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_a8,(string *)&has_null);
  std::__cxx11::string::string((string *)&local_c8,"\x01",&local_101);
  RE2::Options::Options(&local_100,DefaultOptions);
  NegativeTestQuoteMeta(&local_a8,&local_c8,&local_100);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&has_null);
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}